

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HdmiCecSimulationDataGenerator.cpp
# Opt level: O0

void __thiscall
HdmiCecSimulationDataGenerator::GetStandbyTransaction(HdmiCecSimulationDataGenerator *this)

{
  HdmiCecSimulationDataGenerator *this_local;
  
  GenStartSeq(this);
  GenHeaderBlock(this,'\x05','\0',false,true);
  AdvanceRand(this,0.2,0.8);
  if (this->mErrorType == ERR_WRONGEOM) {
    GenDataBlock(this,'6',false,true);
    this->mErrorType = ERR_NOERROR;
  }
  else {
    GenDataBlock(this,'6',true,true);
  }
  AdvanceRand(this,5.0,10.0);
  GenStartSeq(this);
  GenHeaderBlock(this,'\0','\x0f',false,true);
  AdvanceRand(this,0.2,0.8);
  GenDataBlock(this,'6',true,true);
  return;
}

Assistant:

void HdmiCecSimulationDataGenerator::GetStandbyTransaction()
{
    // Audio System sends the TV an standby command
    GenStartSeq();
    GenHeaderBlock( HdmiCec::DevAddress_AudioSystem, HdmiCec::DevAddress_TV );
    AdvanceRand( 0.2f, 0.8f );
    if( mErrorType == ERR_WRONGEOM )
    {
        GenDataBlock( HdmiCec::OpCode_Standby, false, true );
        mErrorType = ERR_NOERROR;
    }
    else
    {
        GenDataBlock( HdmiCec::OpCode_Standby, true, true );
    }

    // The TV decides to forward this message to all the devices
    AdvanceRand( 5.0f, 10.0f );
    GenStartSeq();
    GenHeaderBlock( HdmiCec::DevAddress_TV, HdmiCec::DevAddress_UnregBcast );
    AdvanceRand( 0.2f, 0.8f );
    GenDataBlock( HdmiCec::OpCode_Standby, true, true );
}